

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_remote_port(SessionHandle *data,connectdata *conn)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  int iVar3;
  char *pcVar4;
  unsigned_long ulnum;
  char *pcVar5;
  char *pcVar6;
  uint local_64;
  long port;
  char *rest;
  char type [12];
  char *url;
  char *pcStack_28;
  char endbracket;
  char *portptr;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  portptr = (char *)conn;
  conn_local = (connectdata *)data;
  iVar3 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",(long)&url + 7);
  if ((iVar3 == 1) && (url._7_1_ == ']')) {
    portptr[0x28e] = '\x01';
    *(long *)(portptr + 0xc0) = *(long *)(portptr + 0xc0) + 1;
    pcVar4 = strchr(*(char **)(portptr + 0xc0),0x5d);
    pcStack_28 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcStack_28 = pcVar4 + 1;
      *pcVar4 = '\0';
      if (*pcStack_28 != ':') {
        pcStack_28 = (char *)0x0;
      }
    }
  }
  else {
    pcStack_28 = strrchr(*(char **)(portptr + 0xc0),0x3a);
  }
  if ((conn_local->recv[1] == (Curl_recv *)0x0) || (((ulong)conn_local[0x18].recv[1] & 1) == 0)) {
    if (pcStack_28 != (char *)0x0) {
      ulnum = strtol(pcStack_28 + 1,(char **)&port,10);
      if (((long)ulnum < 0) || (0xffff < (long)ulnum)) {
        Curl_failf((SessionHandle *)conn_local,"Port number out of range");
        return CURLE_URL_MALFORMAT;
      }
      if ((char *)port == pcStack_28 + 1) {
        *pcStack_28 = '\0';
      }
      else {
        *pcStack_28 = '\0';
        uVar2 = curlx_ultous(ulnum);
        *(uint *)(portptr + 0xf8) = (uint)uVar2;
      }
    }
  }
  else {
    *(uint *)(portptr + 0xf8) = (uint)conn_local->recv[1] & 0xffff;
    if (pcStack_28 != (char *)0x0) {
      *pcStack_28 = '\0';
    }
    if ((portptr[0x28b] & 1U) != 0) {
      memset((void *)((long)&rest + 4),0,0xc);
      if ((portptr[0x29f] & 1U) != 0) {
        if ((conn_local->trlMax & 0x1000000) == 0) {
          local_64 = 0x49;
          if ((conn_local->trlPos & 0x100) != 0) {
            local_64 = 0x44;
          }
        }
        else {
          local_64 = 0x41;
        }
        curl_msnprintf((char *)((long)&rest + 4),0xc,";type=%c",(ulong)local_64);
      }
      pcVar4 = "";
      if ((portptr[0x28e] & 1U) != 0) {
        pcVar4 = "[";
      }
      pcVar5 = "";
      if ((portptr[0x28e] & 1U) != 0) {
        pcVar5 = "]";
      }
      pcVar6 = "";
      if (((ulong)conn_local[0x18].send_pipe & 1) != 0) {
        pcVar6 = "/";
      }
      uVar1._0_1_ = conn_local[0x18].readchannel_inuse;
      uVar1._1_1_ = conn_local[0x18].writechannel_inuse;
      uVar1._2_6_ = *(undefined6 *)&conn_local[0x18].field_0x33a;
      type._4_8_ = curl_maprintf("%s://%s%s%s:%hu%s%s%s",**(undefined8 **)(portptr + 0x2d0),pcVar4,
                                 *(undefined8 *)(portptr + 0xc0),pcVar5,
                                 (ulong)*(uint *)(portptr + 0xf8),pcVar6,uVar1,(long)&rest + 4);
      if ((char *)type._4_8_ == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if ((conn_local[1].primary_ip[0x2c] & 1U) != 0) {
        (*Curl_cfree)(*(void **)(conn_local[1].primary_ip + 0x24));
        conn_local[1].primary_ip[0x24] = '\0';
        conn_local[1].primary_ip[0x25] = '\0';
        conn_local[1].primary_ip[0x26] = '\0';
        conn_local[1].primary_ip[0x27] = '\0';
        conn_local[1].primary_ip[0x28] = '\0';
        conn_local[1].primary_ip[0x29] = '\0';
        conn_local[1].primary_ip[0x2a] = '\0';
        conn_local[1].primary_ip[0x2b] = '\0';
        conn_local[1].primary_ip[0x2c] = '\0';
      }
      *(undefined8 *)(conn_local[1].primary_ip + 0x24) = type._4_8_;
      conn_local[1].primary_ip[0x2c] = '\x01';
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode parse_remote_port(struct SessionHandle *data,
                                  struct connectdata *conn)
{
  char *portptr;
  char endbracket;

  /* Note that at this point, the IPv6 address cannot contain any scope
     suffix as that has already been removed in the parseurlandfillconn()
     function */
  if((1 == sscanf(conn->host.name, "[%*45[0123456789abcdefABCDEF:.]%c",
                  &endbracket)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    conn->bits.ipv6_ip = TRUE;

    conn->host.name++; /* skip over the starting bracket */
    portptr = strchr(conn->host.name, ']');
    if(portptr) {
      *portptr++ = '\0'; /* zero terminate, killing the bracket */
      if(':' != *portptr)
        portptr = NULL; /* no port number available */
    }
  }
  else {
#ifdef ENABLE_IPV6
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, conn->host.name, &in6) > 0) {
      /* This is a numerical IPv6 address, meaning this is a wrongly formatted
         URL */
      failf(data, "IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
#endif

    portptr = strrchr(conn->host.name, ':');
  }

  if(data->set.use_port && data->state.allow_port) {
    /* if set, we use this and ignore the port possibly given in the URL */
    conn->remote_port = (unsigned short)data->set.use_port;
    if(portptr)
      *portptr = '\0'; /* cut off the name there anyway - if there was a port
                      number - since the port number is to be ignored! */
    if(conn->bits.httpproxy) {
      /* we need to create new URL with the new port number */
      char *url;
      char type[12]="";

      if(conn->bits.type_set)
        snprintf(type, sizeof(type), ";type=%c",
                 data->set.prefer_ascii?'A':
                 (data->set.ftp_list_only?'D':'I'));

      /*
       * This synthesized URL isn't always right--suffixes like ;type=A are
       * stripped off. It would be better to work directly from the original
       * URL and simply replace the port part of it.
       */
      url = aprintf("%s://%s%s%s:%hu%s%s%s", conn->given->scheme,
                    conn->bits.ipv6_ip?"[":"", conn->host.name,
                    conn->bits.ipv6_ip?"]":"", conn->remote_port,
                    data->state.slash_removed?"/":"", data->state.path,
                    type);
      if(!url)
        return CURLE_OUT_OF_MEMORY;

      if(data->change.url_alloc) {
        Curl_safefree(data->change.url);
        data->change.url_alloc = FALSE;
      }

      data->change.url = url;
      data->change.url_alloc = TRUE;
    }
  }
  else if(portptr) {
    /* no CURLOPT_PORT given, extract the one from the URL */

    char *rest;
    long port;

    port=strtol(portptr+1, &rest, 10);  /* Port number must be decimal */

    if((port < 0) || (port > 0xffff)) {
      /* Single unix standard says port numbers are 16 bits long */
      failf(data, "Port number out of range");
      return CURLE_URL_MALFORMAT;
    }

    else if(rest != &portptr[1]) {
      *portptr = '\0'; /* cut off the name there */
      conn->remote_port = curlx_ultous(port);
    }
    else
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
  }
  return CURLE_OK;
}